

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O1

void ssh_gssapi_bind_fns(ssh_gss_library *lib)

{
  lib->indicate_mech = ssh_gssapi_indicate_mech;
  lib->import_name = ssh_gssapi_import_name;
  lib->release_name = ssh_gssapi_release_name;
  lib->init_sec_context = ssh_gssapi_init_sec_context;
  lib->free_tok = ssh_gssapi_free_tok;
  lib->acquire_cred = ssh_gssapi_acquire_cred;
  lib->release_cred = ssh_gssapi_release_cred;
  lib->get_mic = ssh_gssapi_get_mic;
  lib->verify_mic = ssh_gssapi_verify_mic;
  lib->free_mic = ssh_gssapi_free_mic;
  lib->display_status = ssh_gssapi_display_status;
  return;
}

Assistant:

void ssh_gssapi_bind_fns(struct ssh_gss_library *lib)
{
    lib->indicate_mech = ssh_gssapi_indicate_mech;
    lib->import_name = ssh_gssapi_import_name;
    lib->release_name = ssh_gssapi_release_name;
    lib->init_sec_context = ssh_gssapi_init_sec_context;
    lib->free_tok = ssh_gssapi_free_tok;
    lib->acquire_cred = ssh_gssapi_acquire_cred;
    lib->release_cred = ssh_gssapi_release_cred;
    lib->get_mic = ssh_gssapi_get_mic;
    lib->verify_mic = ssh_gssapi_verify_mic;
    lib->free_mic = ssh_gssapi_free_mic;
    lib->display_status = ssh_gssapi_display_status;
}